

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slarnv.c
# Opt level: O2

int slarnv_slu(int *idist,int *iseed,int *n,float *x)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  slarnv_slu::iv = 1;
  do {
    iVar2 = *n - slarnv_slu::iv;
    if (*n < slarnv_slu::iv) {
      return 0;
    }
    if (0x3e < iVar2) {
      iVar2 = 0x3f;
    }
    slarnv_slu::il = iVar2 + 1;
    slarnv_slu::il2 = slarnv_slu::il << (*idist == 3);
    slaruv_slu(iseed,&slarnv_slu::il2,slarnv_slu::u);
    iVar2 = *idist;
    uVar1 = slarnv_slu::il;
    if (iVar2 == 1) {
      lVar3 = (long)slarnv_slu::iv;
      if (slarnv_slu::il < 1) {
        uVar1 = 0;
      }
      for (lVar4 = 0; (ulong)uVar1 * 4 != lVar4; lVar4 = lVar4 + 4) {
        *(undefined4 *)((long)x + lVar4 + lVar3 * 4 + -4) =
             *(undefined4 *)((long)slarnv_slu::u + lVar4);
      }
LAB_00108773:
      slarnv_slu::i = uVar1 + 1;
    }
    else {
      if (iVar2 == 2) {
        lVar3 = (long)slarnv_slu::iv;
        if (slarnv_slu::il < 1) {
          uVar1 = 0;
        }
        for (lVar4 = 0; (ulong)uVar1 * 4 != lVar4; lVar4 = lVar4 + 4) {
          *(float *)((long)x + lVar4 + lVar3 * 4 + -4) =
               *(float *)((long)slarnv_slu::u + lVar4) + *(float *)((long)slarnv_slu::u + lVar4) +
               -1.0;
        }
        goto LAB_00108773;
      }
      if (iVar2 == 3) {
        slarnv_slu::i = 1;
        while( true ) {
          if (slarnv_slu::il < slarnv_slu::i) break;
          dVar5 = log((double)*(float *)((long)(slarnv_slu::i * 2) * 4 + 0x121298));
          dVar5 = dVar5 * -2.0;
          if (dVar5 < 0.0) {
            dVar5 = sqrt(dVar5);
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          dVar6 = cos((double)(*(float *)((long)(slarnv_slu::i * 2) * 4 + 0x12129c) * 6.2831855));
          x[(long)slarnv_slu::iv + (long)slarnv_slu::i + -2] = (float)(dVar6 * dVar5);
          slarnv_slu::i = slarnv_slu::i + 1;
        }
      }
    }
    slarnv_slu::iv = slarnv_slu::iv + 0x40;
  } while( true );
}

Assistant:

int slarnv_slu(int *idist, int *iseed, int *n, float
	*x)
{
/*  -- LAPACK auxiliary routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

    SLARNV returns a vector of n random real numbers from a uniform or   
    normal distribution.   

    Arguments   
    =========   

    IDIST   (input) INTEGER   
            Specifies the distribution of the random numbers:   
            = 1:  uniform (0,1)   
            = 2:  uniform (-1,1)   
            = 3:  normal (0,1)   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    N       (input) INTEGER   
            The number of random numbers to be generated.   

    X       (output) REAL array, dimension (N)   
            The generated random numbers.   

    Further Details   
    ===============   

    This routine calls the auxiliary routine SLARUV to generate random   
    real numbers from a uniform (0,1) distribution, in batches of up to   
    128 using vectorisable code. The Box-Muller method is used to   
    transform numbers from a uniform to a normal distribution.   

    ===================================================================== 
  


    
   Parameter adjustments   
       Function Body */
    /* System generated locals */
    int i__2, i__3;
    /* Local variables */
    static int i;
    static float u[128];
    static int il, iv, il2;
    extern /* Subroutine */ int slaruv_slu(int *, int *, float *);


#define X(I) x[(I)-1]
#define ISEED(I) iseed[(I)-1]


    for (iv = 1; iv <= *n; iv += 64) {
/* Computing MIN */
	i__2 = 64, i__3 = *n - iv + 1;
	il = SUPERLU_MIN(i__2,i__3);
	if (*idist == 3) {
	    il2 = il << 1;
	} else {
	    il2 = il;
	}

/*        Call SLARUV to generate IL2 numbers from a uniform (0,1)   
          distribution (IL2 <= LV) */

	slaruv_slu(&ISEED(1), &il2, u);

	if (*idist == 1) {

/*           Copy generated numbers */

	    i__2 = il;
	    for (i = 1; i <= il; ++i) {
		X(iv + i - 1) = u[i - 1];
/* L10: */
	    }
	} else if (*idist == 2) {

/*           Convert generated numbers to uniform (-1,1) distribut
ion */

	    i__2 = il;
	    for (i = 1; i <= il; ++i) {
		X(iv + i - 1) = u[i - 1] * 2.f - 1.f;
/* L20: */
	    }
	} else if (*idist == 3) {

/*           Convert generated numbers to normal (0,1) distributio
n */

	    i__2 = il;
	    for (i = 1; i <= il; ++i) {
		X(iv + i - 1) = sqrt(log(u[(i << 1) - 2]) * -2.f) * cos(u[(i 
			<< 1) - 1] * 6.2831853071795864769252867663f);
/* L30: */
	    }
	}
/* L40: */
    }
    return 0;

/*     End of SLARNV */

}